

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall Catch::GeneratorsForTest::moveNext(GeneratorsForTest *this)

{
  pointer ppIVar1;
  pointer ppIVar2;
  int iVar3;
  
  ppIVar1 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppIVar2 = (this->m_generatorsInOrder).
            super__Vector_base<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppIVar2 == ppIVar1) {
      return false;
    }
    iVar3 = (*(*ppIVar2)->_vptr_IGeneratorInfo[2])();
    ppIVar2 = (pointer)((long)ppIVar2 + 8);
  } while ((char)iVar3 == '\0');
  return (bool)(char)iVar3;
}

Assistant:

Equals( std::string const& str, CaseSensitive::Choice caseSensitivity = CaseSensitive::Yes )
            :   m_data( str, caseSensitivity )
            {}